

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  Result RVar1;
  Enum EVar2;
  TableType table_type;
  TableType local_a0;
  ElemType local_80;
  Var local_68;
  
  local_a0.element.enum_ = Any;
  local_a0.element.type_index_ = 0xffffffff;
  local_a0.limits.initial = 0;
  local_a0.limits.max._0_7_ = 0;
  local_a0.limits._15_4_ = 0;
  EVar2 = Ok;
  if (kind == Active) {
    Var::Var(&local_68,table_var);
    RVar1 = CheckTableIndex(this,&local_68,&local_a0);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    Var::~Var(&local_68);
  }
  local_80.is_active = kind == Active;
  local_80.element.enum_ = Void;
  local_80.element.type_index_ = 0xffffffff;
  local_80.table_type = local_a0.element;
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  emplace_back<wabt::SharedValidator::ElemType>(&this->elems_,&local_80);
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  TableType table_type;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var, &table_type);
  }
  // Type gets set later in OnElemSegmentElemType.
  elems_.push_back(
      ElemType{Type::Void, kind == SegmentKind::Active, table_type.element});
  return result;
}